

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O2

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,void *buffer,size_t size,
          size_t chunkSize,CrtAllocator *baseAllocator)

{
  SharedData *pSVar1;
  ulong local_18;
  
  this->chunk_capacity_ = chunkSize;
  this->baseAllocator_ = baseAllocator;
  local_18 = size;
  pSVar1 = (SharedData *)AlignBuffer(buffer,&local_18);
  this->shared_ = pSVar1;
  if (0x37 < local_18) {
    pSVar1->chunkHead = (ChunkHeader *)(pSVar1 + 1);
    pSVar1[1].chunkHead = (ChunkHeader *)(local_18 - 0x38);
    pSVar1->ownBaseAllocator = (CrtAllocator *)0x0;
    pSVar1->ownBuffer = false;
    pSVar1[1].ownBaseAllocator = (CrtAllocator *)0x0;
    pSVar1[1].refcount = 0;
    pSVar1->refcount = 1;
    return;
  }
  __assert_fail("size >= SIZEOF_SHARED_DATA + SIZEOF_CHUNK_HEADER",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/allocators.h"
                ,0xce,
                "rapidjson::MemoryPoolAllocator<>::MemoryPoolAllocator(void *, size_t, size_t, BaseAllocator *) [BaseAllocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

MemoryPoolAllocator(void *buffer, size_t size, size_t chunkSize = kDefaultChunkCapacity, BaseAllocator* baseAllocator = 0) :
        chunk_capacity_(chunkSize),
        baseAllocator_(baseAllocator),
        shared_(static_cast<SharedData*>(AlignBuffer(buffer, size)))
    {
        RAPIDJSON_ASSERT(size >= SIZEOF_SHARED_DATA + SIZEOF_CHUNK_HEADER);
        shared_->chunkHead = GetChunkHead(shared_);
        shared_->chunkHead->capacity = size - SIZEOF_SHARED_DATA - SIZEOF_CHUNK_HEADER;
        shared_->chunkHead->size = 0;
        shared_->chunkHead->next = 0;
        shared_->ownBaseAllocator = 0;
        shared_->ownBuffer = false;
        shared_->refcount = 1;
    }